

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int recvMax(void *buf,int bufsize,int sent)

{
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int count;
  int fetch;
  int remaining;
  uint8_t scratch [4096];
  int local_1024;
  uint local_1020;
  uint local_101c;
  undefined1 local_1018 [4104];
  int local_10;
  
  local_1024 = in_ESI;
  if (in_EDX < in_ESI) {
    local_1024 = in_EDX;
  }
  local_10 = in_EDX;
  if (local_1024 != 0) {
    recv(gPigCommand,in_RDI,(long)local_1024,0x100);
  }
  for (local_101c = local_10 - local_1024; local_101c != 0; local_101c = local_101c - local_1020) {
    local_1020 = local_101c;
    if (0x1000 < local_101c) {
      local_1020 = 0x1000;
    }
    recv(gPigCommand,local_1018,(long)(int)local_1020,0x100);
  }
  return local_1024;
}

Assistant:

int recvMax(void *buf, int bufsize, int sent)
{
   uint8_t scratch[4096];
   int remaining, fetch, count;

   if (sent < bufsize) count = sent; else count = bufsize;

   if (count) recv(gPigCommand, buf, count, MSG_WAITALL);

   remaining = sent - count;

   while (remaining)
   {
      fetch = remaining;
      if (fetch > sizeof(scratch)) fetch = sizeof(scratch);
      recv(gPigCommand, scratch, fetch, MSG_WAITALL);
      remaining -= fetch;
   }

   return count;
}